

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::LessThanEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  const_reference pvVar9;
  idx_t iVar10;
  long lVar11;
  long lVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  idx_t iVar17;
  long lVar18;
  idx_t iVar19;
  bool bVar20;
  interval_t *lhs_data;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_88;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar17 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_88 = 0;
      iVar19 = 0;
      do {
        iVar13 = iVar19;
        if (psVar6 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar6[iVar19];
        }
        iVar10 = iVar13;
        if (psVar7 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar7[iVar13];
        }
        lVar14 = *(long *)(pdVar4 + iVar13 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar14 + (col_idx >> 3))) == 0) {
LAB_015dc9fc:
          *no_match_count = iVar17 + 1;
          no_match_sel->sel_vector[iVar17] = (sel_t)iVar13;
          iVar17 = iVar17 + 1;
        }
        else {
          lVar18 = iVar10 * 0x10;
          lVar8 = *(long *)(lVar14 + 8 + vVar5);
          lVar16 = (long)*(int *)(pdVar3 + lVar18 + 4) +
                   *(long *)(pdVar3 + lVar18 + 8) / 86400000000;
          lVar15 = lVar16 % 0x1e;
          lVar12 = (long)*(int *)(pdVar3 + lVar18) + lVar16 / 0x1e;
          lVar11 = (*(long *)(lVar14 + vVar5) >> 0x20) + lVar8 / 86400000000;
          lVar16 = lVar11 % 0x1e;
          lVar14 = (long)(int)*(long *)(lVar14 + vVar5) + lVar11 / 0x1e;
          if ((lVar14 < lVar12) ||
             ((lVar14 <= lVar12 &&
              ((lVar16 < lVar15 ||
               ((lVar16 <= lVar15 &&
                (lVar8 % 86400000000 < *(long *)(pdVar3 + lVar18 + 8) % 86400000000))))))))
          goto LAB_015dc9fc;
          psVar6[local_88] = (sel_t)iVar13;
          local_88 = local_88 + 1;
        }
        iVar19 = iVar19 + 1;
        if (count == iVar19) {
          return local_88;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    iVar17 = *no_match_count;
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_88 = 0;
    iVar19 = 0;
    do {
      iVar13 = iVar19;
      if (psVar6 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar6[iVar19];
      }
      iVar10 = iVar13;
      if (psVar7 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar7[iVar13];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = (puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0;
      }
      if ((bVar20) ||
         (lVar14 = *(long *)(pdVar4 + iVar13 * 8),
         ((uint)*(byte *)(lVar14 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_015dc849:
        *no_match_count = iVar17 + 1;
        no_match_sel->sel_vector[iVar17] = (sel_t)iVar13;
        iVar17 = iVar17 + 1;
      }
      else {
        lVar11 = iVar10 * 0x10;
        lVar8 = *(long *)(lVar14 + 8 + vVar5);
        lVar16 = (long)*(int *)(pdVar3 + lVar11 + 4) + *(long *)(pdVar3 + lVar11 + 8) / 86400000000;
        lVar18 = lVar16 % 0x1e;
        lVar12 = (long)*(int *)(pdVar3 + lVar11) + lVar16 / 0x1e;
        lVar15 = (*(long *)(lVar14 + vVar5) >> 0x20) + lVar8 / 86400000000;
        lVar16 = lVar15 % 0x1e;
        lVar14 = (long)(int)*(long *)(lVar14 + vVar5) + lVar15 / 0x1e;
        if ((lVar14 < lVar12) ||
           ((lVar14 <= lVar12 &&
            ((lVar16 < lVar18 ||
             ((lVar16 <= lVar18 &&
              (lVar8 % 86400000000 < *(long *)(pdVar3 + lVar11 + 8) % 86400000000))))))))
        goto LAB_015dc849;
        psVar6[local_88] = (sel_t)iVar13;
        local_88 = local_88 + 1;
      }
      iVar19 = iVar19 + 1;
      if (count == iVar19) {
        return local_88;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}